

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O0

int ed25519_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  size_t sVar1;
  uint8_t *in;
  CBS *key_local;
  CBS *params_local;
  EVP_PKEY *out_local;
  
  sVar1 = CBS_len(params);
  if (sVar1 == 0) {
    in = CBS_data(key);
    sVar1 = CBS_len(key);
    out_local._4_4_ = ed25519_set_pub_raw(out,in,sVar1);
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                  ,0x79);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static int ed25519_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 8410, section 4.

  // The parameters must be omitted. Public keys have length 32.
  if (CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  return ed25519_set_pub_raw(out, CBS_data(key), CBS_len(key));
}